

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall
cmComputeLinkInformation::CheckImplicitDirItem(cmComputeLinkInformation *this,string *item)

{
  bool bVar1;
  PolicyStatus PVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string *local_90;
  string *wid;
  string file;
  _Self local_60 [3];
  _Self local_48;
  undefined1 local_40 [8];
  string dir;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  if ((this->LinkTypeEnabled & 1U) == 0) {
    return false;
  }
  dir.field_2._8_8_ = item;
  cmsys::SystemTools::GetFilenamePath((string *)local_40,item);
  local_48._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->ImplicitLinkDirs,(string *)local_40);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->ImplicitLinkDirs);
  bVar1 = std::operator==(&local_48,local_60);
  if (bVar1) {
    this_local._7_1_ = false;
    file.field_2._12_4_ = 1;
    goto LAB_007cf6de;
  }
  cmsys::SystemTools::GetFilenameName((string *)&wid,(string *)dir.field_2._8_8_);
  bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,(string *)&wid);
  if (bVar1) {
    PVar2 = cmTarget::GetPolicyStatusCMP0060(this->Target);
    if (PVar2 != OLD) {
      if (PVar2 == WARN) {
        if ((this->CMP0060Warn & 1U) != 0) {
          std::operator+(&local_b0,"CMP0060-WARNING-GIVEN-",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         dir.field_2._8_8_);
          local_90 = &local_b0;
          bVar1 = cmake::GetPropertyAsBool(this->CMakeInstance,local_90);
          if (!bVar1) {
            cmake::SetProperty(this->CMakeInstance,local_90,"1");
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->CMP0060WarnItems,(value_type *)dir.field_2._8_8_);
          }
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
      else if (PVar2 - NEW < 3) {
        this_local._7_1_ = false;
        goto LAB_007cf6c8;
      }
    }
    AddUserItem(this,(string *)&wid,false);
    cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,(string *)dir.field_2._8_8_);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_007cf6c8:
  file.field_2._12_4_ = 1;
  std::__cxx11::string::~string((string *)&wid);
LAB_007cf6de:
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmComputeLinkInformation::CheckImplicitDirItem(std::string const& item)
{
  // We only switch to a pathless item if the link type may be
  // enforced.  Fortunately only platforms that support link types
  // seem to have magic per-architecture implicit link directories.
  if(!this->LinkTypeEnabled)
    {
    return false;
    }

  // Check if this item is in an implicit link directory.
  std::string dir = cmSystemTools::GetFilenamePath(item);
  if(this->ImplicitLinkDirs.find(dir) == this->ImplicitLinkDirs.end())
    {
    // Only libraries in implicit link directories are converted to
    // pathless items.
    return false;
    }

  // Only apply the policy below if the library file is one that can
  // be found by the linker.
  std::string file = cmSystemTools::GetFilenameName(item);
  if(!this->ExtractAnyLibraryName.find(file))
    {
    return false;
    }

  // Check the policy for whether we should use the approach below.
  switch (this->Target->GetPolicyStatusCMP0060())
    {
    case cmPolicies::WARN:
      if (this->CMP0060Warn)
        {
        // Print the warning at most once for this item.
        std::string const& wid = "CMP0060-WARNING-GIVEN-" + item;
        if (!this->CMakeInstance->GetPropertyAsBool(wid))
          {
          this->CMakeInstance->SetProperty(wid, "1");
          this->CMP0060WarnItems.insert(item);
          }
        }
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      return false;
    }

  // Many system linkers support multiple architectures by
  // automatically selecting the implicit linker search path for the
  // current architecture.  If the library appears in an implicit link
  // directory then just report the file name without the directory
  // portion.  This will allow the system linker to locate the proper
  // library for the architecture at link time.
  this->AddUserItem(file, false);

  // Make sure the link directory ordering will find the library.
  this->OrderLinkerSearchPath->AddLinkLibrary(item);

  return true;
}